

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool c4::yml::anon_unknown_0::_is_scalar_next__rmap_val(csubstr s)

{
  ro_substr pattern;
  bool bVar1;
  int iVar2;
  size_t in_RSI;
  char *in_RDI;
  basic_substring<const_char> *in_stack_00000038;
  bool local_41;
  ro_substr local_40;
  basic_substring<char_const> local_30 [8];
  basic_substring<const_char> *in_stack_ffffffffffffffd8;
  
  basic_substring<char_const>::basic_substring<3ul>(local_30,(char (*) [3])0x358c90);
  pattern.len = in_RSI;
  pattern.str = in_RDI;
  bVar1 = basic_substring<const_char>::begins_with(in_stack_ffffffffffffffd8,pattern);
  local_41 = true;
  if (!bVar1) {
    basic_substring<char_const>::basic_substring<3ul>
              ((basic_substring<char_const> *)&local_40,(char (*) [3])"{[");
    bVar1 = basic_substring<const_char>::begins_with_any
                      ((basic_substring<const_char> *)&stack0xffffffffffffffe0,local_40);
    local_41 = true;
    if (!bVar1) {
      iVar2 = basic_substring<const_char>::compare(in_stack_00000038,(char *)s.len,(size_t)s.str);
      local_41 = iVar2 == 0;
    }
  }
  return (bool)((local_41 ^ 0xffU) & 1);
}

Assistant:

bool _is_scalar_next__rmap_val(csubstr s)
{
    return !(s.begins_with("- ") || s.begins_with_any("{[") || s == "-");
}